

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::ImmutableMessageGenerator
          (ImmutableMessageGenerator *this,Descriptor *descriptor,Context *context)

{
  bool bVar1;
  ClassNameResolver *pCVar2;
  FileDescriptor *descriptor_00;
  LogMessage *pLVar3;
  LogFinisher local_6a;
  byte local_69;
  LogMessage local_68;
  Context *local_20;
  Context *context_local;
  Descriptor *descriptor_local;
  ImmutableMessageGenerator *this_local;
  
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (Descriptor *)this;
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageGenerator_006f5028;
  this->context_ = local_20;
  pCVar2 = Context::GetNameResolver(local_20);
  this->name_resolver_ = pCVar2;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)context_local,this->context_);
  local_69 = 0;
  descriptor_00 = Descriptor::file((Descriptor *)context_local);
  bVar1 = Context::EnforceLite(local_20);
  bVar1 = HasDescriptorMethods(descriptor_00,bVar1);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message.cc"
               ,0x61);
    local_69 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_6a,pLVar3);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

ImmutableMessageGenerator::ImmutableMessageGenerator(
    const Descriptor* descriptor, Context* context)
  : MessageGenerator(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()),
    field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
}